

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

uint32 osc::ToUInt32(char *p)

{
  undefined4 local_14;
  anon_union_4_2_94730047 u;
  char *p_local;
  
  local_14 = CONCAT13(*p,CONCAT12(p[1],CONCAT11(p[2],p[3])));
  return local_14;
}

Assistant:

static inline uint32 ToUInt32( const char *p )
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        osc::uint32 i;
        char c[4];
    } u;

    u.c[0] = p[3];
    u.c[1] = p[2];
    u.c[2] = p[1];
    u.c[3] = p[0];

    return u.i;
#else
	return *(uint32*)p;
#endif
}